

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
 wabt::MakeUnique<wabt::BlockExprBase<(wabt::ExprType)26>>(void)

{
  BlockExprBase<(wabt::ExprType)26> *this;
  __uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>,_true,_true>
  in_RDI;
  Location local_30;
  
  this = (BlockExprBase<(wabt::ExprType)26> *)operator_new(0x118);
  Location::Location(&local_30);
  BlockExprBase<(wabt::ExprType)26>::BlockExprBase(this,&local_30);
  std::
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>>>
  ::unique_ptr<std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>>,void>
            ((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>>>
              *)in_RDI.
                super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)26>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
                .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)26>_*,_false>.
                _M_head_impl,this);
  return (__uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>,_true,_true>
          )(tuple<wabt::BlockExprBase<(wabt::ExprType)26>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
            )in_RDI.
             super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)26>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
             .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)26>_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}